

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_interpolator_tests.cpp
# Opt level: O1

void process<ear::dsp::GainInterpolator<ear::dsp::LinearInterpVector>>
               (GainInterpolator<ear::dsp::LinearInterpVector> *interp,SampleIndex block_start,
               Ref<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *in,
               Ref<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *out)

{
  PtrAdapter out_p;
  PtrAdapterConst in_p;
  allocator_type local_59;
  vector<float_*,_std::allocator<float_*>_> local_58;
  float **local_40 [2];
  long local_30;
  
  std::vector<const_float_*,_std::allocator<const_float_*>_>::vector
            ((vector<const_float_*,_std::allocator<const_float_*>_> *)local_40,
             (in->
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_cols.m_value,(allocator_type *)&local_58);
  ear::dsp::PtrAdapterT<float_const*>::
  set_eigen<Eigen::Ref<Eigen::Matrix<float,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>const&>
            ((PtrAdapterT<float_const*> *)local_40,in,0);
  std::vector<float_*,_std::allocator<float_*>_>::vector
            (&local_58,
             (out->
             super_RefBase<Eigen::Ref<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_cols.m_value,&local_59);
  ear::dsp::PtrAdapterT<float*>::
  set_eigen<Eigen::Ref<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>&>
            ((PtrAdapterT<float*> *)&local_58,out,0);
  ear::dsp::GainInterpolator<ear::dsp::LinearInterpVector>::process
            (interp,block_start,
             (in->
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value,local_40[0],
             local_58.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (local_58.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (float **)0x0) {
    operator_delete(local_58.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_40[0] != (float **)0x0) {
    operator_delete(local_40[0],local_30 - (long)local_40[0]);
  }
  return;
}

Assistant:

void process(Interp &interp, SampleIndex block_start,
             const Eigen::Ref<const Eigen::MatrixXf> &in,
             Eigen::Ref<Eigen::MatrixXf> out) {
  PtrAdapterConst in_p(in.cols());
  in_p.set_eigen(in);
  PtrAdapter out_p(out.cols());
  out_p.set_eigen(out);

  interp.process(block_start, in.rows(), in_p.ptrs(), out_p.ptrs());
}